

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O0

string * __thiscall
libtorrent::aux::utf8_latin1_abi_cxx11_(string *__return_storage_ptr__,aux *this,string_view sv)

{
  bool bVar1;
  invalid_argument *this_00;
  char *extraout_RDX;
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  type_conflict2 *local_68;
  type *len;
  type *cp;
  aux *local_48;
  size_t sStack_40;
  pair<int,_int> local_34;
  undefined1 local_29;
  undefined1 auStack_28 [8];
  string_view sv_local;
  string *out;
  
  sv_local._M_len = sv._M_len;
  local_29 = 0;
  auStack_28 = (undefined1  [8])this;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  while( true ) {
    bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return __return_storage_ptr__;
    }
    local_48 = (aux *)auStack_28;
    sStack_40 = sv_local._M_len;
    str._M_str = extraout_RDX;
    str._M_len = sv_local._M_len;
    local_34 = parse_utf8_codepoint((aux *)auStack_28,str);
    len = ::std::get<0ul,int,int>(&local_34);
    local_68 = ::std::get<1ul,int,int>(&local_34);
    if ((*len == -1) || (0xff < *len)) break;
    bVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28,
                       (long)*local_68,0xffffffffffffffff);
    sv_local._M_len = (size_t)bVar2._M_str;
    auStack_28 = (undefined1  [8])bVar2._M_len;
    ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::to_string(&local_a8,*len);
  ::std::operator+(&local_88,"code point out of latin1 range: ",&local_a8);
  ::std::invalid_argument::invalid_argument(this_00,(string *)&local_88);
  __cxa_throw(this_00,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument)
  ;
}

Assistant:

std::string utf8_latin1(std::string_view sv)
	{
		std::string out;
		while (!sv.empty())
		{
			auto const [cp, len] = parse_utf8_codepoint(sv);

			if (cp == -1 || cp > 0xff)
				throw std::invalid_argument("code point out of latin1 range: " + std::to_string(cp));

			sv = sv.substr(std::size_t(len));

			out.push_back(char(static_cast<unsigned char>(cp)));
		}
		return out;
	}